

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

void __thiscall cppcms::http::response::io_mode(response *this,io_mode_type mode)

{
  cppcms_error *this_00;
  allocator local_39;
  string local_38;
  
  if ((this->field_0x1c & 2) == 0) {
    this->io_mode_ = mode;
    return;
  }
  this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_38,"Can\'t set mode after requesting output stream",&local_39);
  cppcms_error::cppcms_error(this_00,&local_38);
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void response::io_mode(response::io_mode_type mode)
{
	if(ostream_requested_)
		throw cppcms_error("Can't set mode after requesting output stream");
	io_mode_=mode;
}